

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_set_exif(LodePNGInfo *info,uchar *exif,uint exif_size)

{
  uint uVar1;
  uchar *__dest;
  
  if (info->exif_defined != 0) {
    free(info->exif);
    info->exif_size = 0;
    info->exif_defined = 0;
  }
  __dest = (uchar *)malloc((ulong)exif_size);
  info->exif = __dest;
  if (__dest == (uchar *)0x0) {
    uVar1 = 0x53;
  }
  else {
    if (exif_size != 0) {
      memcpy(__dest,exif,(ulong)exif_size);
    }
    info->exif_size = exif_size;
    info->exif_defined = 1;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned lodepng_set_exif(LodePNGInfo* info, const unsigned char* exif, unsigned exif_size) {
  if(info->exif_defined) lodepng_clear_exif(info);
  info->exif = (unsigned char*)lodepng_malloc(exif_size);

  if(!info->exif) return 83; /*alloc fail*/

  lodepng_memcpy(info->exif, exif, exif_size);
  info->exif_size = exif_size;
  info->exif_defined = 1;

  return 0; /*ok*/
}